

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O3

uint64_t dg::llvmutils::getAllocatedSize(AllocaInst *AI,DataLayout *DL)

{
  uint uVar1;
  SmallPtrSetImpl *Ty;
  undefined1 auVar3 [16];
  char cVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  TypeSize TVar9;
  TypeSize local_38;
  undefined1 auVar2 [12];
  
  Ty = *(SmallPtrSetImpl **)(AI + 0x40);
  uVar1 = *(uint *)(Ty + 8);
  if ((byte)uVar1 < 0x12) {
    if ((0xac7fU >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x30000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0011feb9;
      goto LAB_0011fea2;
    }
  }
  else {
LAB_0011feb9:
    if ((uVar1 & 0xfe) != 0x12) {
      return 0;
    }
LAB_0011fea2:
    cVar4 = llvm::Type::isSizedDerivedType(Ty);
    if (cVar4 == '\0') {
      return 0;
    }
  }
  cVar4 = llvm::AllocaInst::isArrayAllocation();
  if (cVar4 == '\0') {
    TVar9 = llvm::DataLayout::getTypeAllocSize(DL,(Type *)Ty);
    auVar2 = TVar9.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>._0_12_;
    goto LAB_0011fe77;
  }
  lVar8 = *(long *)(AI + -0x20);
  plVar6 = &Offset::UNKNOWN;
  if ((lVar8 == 0) || (*(char *)(lVar8 + 0x10) != '\x10')) {
LAB_0011fe4f:
    lVar8 = *plVar6;
    if (lVar8 == -1) goto LAB_0011fe58;
  }
  else {
    uVar1 = *(uint *)(lVar8 + 0x20);
    plVar6 = (long *)(lVar8 + 0x18);
    if ((uVar1 < 0x41) || (iVar5 = llvm::APInt::countLeadingZerosSlowCase(), uVar1 - iVar5 < 0x41))
    {
      if (0x40 < uVar1) {
        plVar6 = (long *)*plVar6;
      }
      goto LAB_0011fe4f;
    }
LAB_0011fe58:
    lVar8 = 0;
  }
  TVar9 = llvm::DataLayout::getTypeAllocSize(DL,(Type *)Ty);
  auVar3._8_8_ = TVar9.super_LinearPolySize<llvm::TypeSize>.
                 super_UnivariateLinearPolyBase<llvm::TypeSize>._8_8_;
  auVar3._0_8_ = TVar9.super_LinearPolySize<llvm::TypeSize>.
                 super_UnivariateLinearPolyBase<llvm::TypeSize>.Value * lVar8;
  auVar2 = auVar3._0_12_;
LAB_0011fe77:
  local_38.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.Value
       = auVar2._0_8_;
  local_38.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
  UnivariateDim = auVar2._8_4_;
  uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_38);
  return uVar7;
}

Assistant:

inline uint64_t getAllocatedSize(const llvm::AllocaInst *AI,
                                 const llvm::DataLayout *DL) {
    llvm::Type *Ty = AI->getAllocatedType();
    if (!Ty->isSized())
        return 0;

    if (AI->isArrayAllocation()) {
        return getConstantSizeValue(AI->getArraySize()) *
               DL->getTypeAllocSize(Ty);
    }
    return DL->getTypeAllocSize(Ty);
}